

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

DatabaseInterface * Fossilize::create_database(char *path,DatabaseMode mode)

{
  bool bVar1;
  allocator local_61;
  string local_60;
  undefined1 local_40 [8];
  string ext;
  DatabaseMode mode_local;
  char *path_local;
  
  ext.field_2._12_4_ = mode;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,path,&local_61);
  Path::ext((string *)local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_40,"foz");
  if (bVar1) {
    path_local = (char *)create_stream_archive_database(path,ext.field_2._12_4_);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,"zip");
    if (bVar1) {
      path_local = (char *)create_zip_archive_database(path,ext.field_2._12_4_);
    }
    else {
      path_local = (char *)create_dumb_folder_database(path,ext.field_2._12_4_);
    }
  }
  std::__cxx11::string::~string((string *)local_40);
  return (DatabaseInterface *)path_local;
}

Assistant:

DatabaseInterface *create_database(const char *path, DatabaseMode mode)
{
	auto ext = Path::ext(path);
	if (ext == "foz")
		return create_stream_archive_database(path, mode);
	else if (ext == "zip")
		return create_zip_archive_database(path, mode);
	else
		return create_dumb_folder_database(path, mode);
}